

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_3.cpp
# Opt level: O1

void __thiscall Date::add_day(Date *this,int n)

{
  undefined8 extraout_RAX;
  string local_30;
  
  if (n < 1) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"add_day() - negative argument passed","");
    error(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  do {
    increment_day(this);
    n = n + -1;
  } while (n != 0);
  return;
}

Assistant:

void Date::add_day(int n)
{
	if (n <= 0)
		error("add_day() - negative argument passed");
	for (int i = 0; i < n; ++i)
		increment_day();
}